

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.c
# Opt level: O1

int assert_match(char *pattern,char *subject,int expected)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  regex_handle re;
  regex_handle local_38;
  
  local_38.priv = (void *)0x0;
  iVar2 = regex_init(&local_38);
  if (iVar2 < 0) {
    assert_match_cold_2();
  }
  else {
    iVar2 = regex_compile(&local_38,pattern);
    if (iVar2 < 0) {
      assert_match_cold_1();
    }
    else {
      iVar2 = regex_is_match(&local_38,subject);
      pFVar1 = _stderr;
      if (iVar2 < 0) {
        pcVar4 = strerror(-iVar2);
        fprintf(pFVar1,"Error: Failed to match \'%s\' against \'%s\' (%d): %s\n",subject,pattern,
                (ulong)(uint)-iVar2,pcVar4);
      }
    }
    regex_free(&local_38);
  }
  pFVar1 = _stderr;
  iVar3 = 0;
  if (iVar2 != expected) {
    if (iVar2 == 0) {
      pcVar4 = "Error: Regex \'%s\' was expected to match subject \'%s\', but did not\n";
    }
    else {
      if (iVar2 != 1) {
        pcVar4 = strerror(-iVar2);
        fprintf(pFVar1,
                "Error: Failure while attempting to match regex \'%s\' to subject \'%s\' (%d): %s\n"
                ,pattern,subject,(ulong)(uint)-iVar2,pcVar4);
        return iVar2;
      }
      pcVar4 = "Error: Regex \'%s\' was not expected to match subject \'%s\', but did\n";
    }
    fprintf(_stderr,pcVar4,pattern,subject);
    iVar3 = -0x16;
  }
  return iVar3;
}

Assistant:

static int assert_match(const char * const pattern, const char * const subject,
			int expected)
{
	int ret = try_match(pattern, subject);

	if (ret != expected) {
		switch (ret) {
		case 1:
			fprintf(stderr,
				"Error: Regex '%s' was not expected to match subject '%s', but did\n",
				pattern, subject);
			ret = -EINVAL;
			break;
		case 0:
			fprintf(stderr,
				"Error: Regex '%s' was expected to match subject '%s', but did not\n",
				pattern, subject);
			ret = -EINVAL;
			break;
		default:
			fprintf(stderr,
				"Error: Failure while attempting to match regex '%s' to subject '%s' (%d): %s\n",
				pattern, subject, -ret, strerror(-ret));
			break;
		}

		return ret;
	}

	return 0;
}